

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordered_guardedTests.cpp
# Opt level: O3

void __thiscall
ordered_guarded_ordered_guarded_1_Test::~ordered_guarded_ordered_guarded_1_Test
          (ordered_guarded_ordered_guarded_1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ordered_guarded, ordered_guarded_1)
{
    ordered_guarded<int, shared_mutex> data(0);

    data.modify([](int& value) { ++value; });

    {
        auto data_handle = data.lock_shared();

        std::atomic<bool> th1_ok(true);
        std::atomic<bool> th2_ok(true);
        std::atomic<bool> th3_ok(true);

        EXPECT_TRUE(data_handle);
        EXPECT_EQ(*data_handle, 1);

        std::thread th1([&data, &th1_ok]() {
            auto data_handle2 = data.try_lock_shared();
            if (!data_handle2) {
                th1_ok = false;
            }
            if (*data_handle2 != 1) {
                th1_ok = false;
            }
        });

        std::thread th2([&data, &th2_ok]() {
            auto data_handle2 =
                data.try_lock_shared_for(std::chrono::milliseconds(20));
            if (!data_handle2) {
                th2_ok = false;
            }
            if (*data_handle2 != 1) {
                th2_ok = false;
            }
        });

        std::thread th3([&data, &th3_ok]() {
            auto data_handle2 =
                data.try_lock_shared_until(std::chrono::steady_clock::now() +
                                           std::chrono::milliseconds(20));
            if (!data_handle2) {
                th3_ok = false;
            }
            if (*data_handle2 != 1) {
                th3_ok = false;
            }
        });

        th1.join();
        th2.join();
        th3.join();
        EXPECT_TRUE(th1_ok == true);
        EXPECT_TRUE(th2_ok == true);
        EXPECT_TRUE(th3_ok == true);
    }
}